

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O0

void __thiscall iu_Optional_x_iutest_x_Compare_Test::Body(iu_Optional_x_iutest_x_Compare_Test *this)

{
  bool bVar1;
  char *pcVar2;
  optional<int> *b;
  char *in_R9;
  optional<int> *val2;
  type **in_stack_fffffffffffff578;
  AssertionHelper local_9f8;
  Fixed local_9c8;
  anon_class_1_0_00000001 local_839;
  undefined1 local_838 [8];
  AssertionResult iutest_spi_ar;
  AssertionHelper local_7f0;
  Fixed local_7c0;
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5d8;
  undefined1 local_450 [8];
  AssertionResult iutest_ar_2;
  optional<int> local_420;
  optional<int> opt_2;
  Fixed local_3e8;
  char local_25c [4];
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  undefined1 local_18 [8];
  optional<int> opt_1;
  iu_Optional_x_iutest_x_Compare_Test *this_local;
  
  iutest_ar._36_4_ = 0;
  opt_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)this;
  std::optional<int>::optional<int,_true>((optional<int> *)local_18,(int *)&iutest_ar.field_0x24);
  iutest::detail::AlwaysZero();
  iutest::AssertionResult::Is<std::optional<int>>
            ((AssertionResult *)local_48,(AssertionResult *)local_18,b);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_1.m_result,(internal *)local_48,(AssertionResult *)0x18b2d7,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x52,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  iutest::detail::AlwaysZero();
  local_25c[0] = '\0';
  local_25c[1] = '\0';
  local_25c[2] = '\0';
  local_25c[3] = '\0';
  val2 = (optional<int> *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::backward::EqHelper<true>::Compare<int,std::optional<int>>
            ((AssertionResult *)local_258,(EqHelper<true> *)0x18b3b7,"opt",local_25c,(int *)local_18
             ,(optional<int> *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffff578
            );
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    memset(&local_3e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_258);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&opt_2,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x53,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&opt_2,&local_3e8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&opt_2);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  std::optional<int>::optional(&local_420);
  iutest::detail::AlwaysZero();
  iutest::internal::backward::EqHelper<false>::Compare<std::nullopt_t,std::optional<int>>
            ((AssertionResult *)local_450,(EqHelper<false> *)"::std::nullopt","opt","",
             (nullopt_t *)&local_420,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    memset(&local_5d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_450);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x57,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  iutest::detail::AlwaysZero();
  local_631 = std::optional::operator_cast_to_bool((optional *)&Body::opt);
  local_631 = !local_631;
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_630,&local_631);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    memset(&local_7c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_spi_ar.m_result,(internal *)local_630,(AssertionResult *)0x18b2d7,
               "true","false",(char *)val2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x5b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_7f0,&local_7c0);
    iutest::AssertionHelper::~AssertionHelper(&local_7f0);
    std::__cxx11::string::~string((string *)&iutest_spi_ar.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_838,&local_839);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar1) {
    memset(&local_9c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_838);
    iutest::AssertionHelper::AssertionHelper
              (&local_9f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x5c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_9f8,&local_9c8);
    iutest::AssertionHelper::~AssertionHelper(&local_9f8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  return;
}

Assistant:

IUTEST(Optional, Compare)
{
    {
        ::std::optional<int> opt = 0;
        IUTEST_EXPECT_TRUE(opt);
        IUTEST_EXPECT_EQ(0, opt);
    }
    {
        ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_EQ(::std::nullopt, opt);
    }
    {
        static const ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_FALSE(opt);
        IUTEST_EXPECT_NONFATAL_FAILURE(IUTEST_EXPECT_EQ(1234, opt), "1234");
    }
}